

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (Message *message,FieldDescriptorSet *extensions)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  undefined4 extraout_var;
  UnknownFieldSet *this;
  size_type sVar5;
  reference ppFVar6;
  Message *pMVar7;
  Message *sub_message_1;
  Message *sub_message;
  int j;
  int size;
  int local_50;
  int i;
  undefined1 local_40 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  FieldDescriptorSet *extensions_local;
  Message *message_local;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  this = (UnknownFieldSet *)
         (**(code **)(*fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10))
                   (fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,message);
  iVar3 = UnknownFieldSet::field_count(this);
  if (iVar3 < 1) {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_40);
    (**(code **)(*fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x80))
              (fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_40);
    for (local_50 = 0;
        sVar5 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_40), (ulong)(long)local_50 < sVar5; local_50 = local_50 + 1) {
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_40,(long)local_50);
      bVar2 = FieldDescriptor::is_extension(*ppFVar6);
      if (bVar2) {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)local_50);
        std::
        set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::insert(extensions,ppFVar6);
      }
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_40,(long)local_50);
      JVar4 = GetJavaType(*ppFVar6);
      if (JVar4 == JAVATYPE_MESSAGE) {
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_40,(long)local_50);
        bVar2 = FieldDescriptor::is_repeated(*ppFVar6);
        ppFVar1 = fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (bVar2) {
          ppFVar6 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  *)local_40,(long)local_50);
          iVar3 = (**(code **)(*ppFVar1 + 0x30))(ppFVar1,message,*ppFVar6);
          for (sub_message._0_4_ = 0;
              ppFVar1 = fields.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage, (int)sub_message < iVar3
              ; sub_message._0_4_ = (int)sub_message + 1) {
            ppFVar6 = std::
                      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    *)local_40,(long)local_50);
            pMVar7 = (Message *)
                     (**(code **)(*ppFVar1 + 0x1a0))(ppFVar1,message,*ppFVar6,(int)sub_message);
            bVar2 = CollectExtensions(pMVar7,extensions);
            if (!bVar2) {
              message_local._7_1_ = false;
              goto LAB_0041e4f5;
            }
          }
        }
        else {
          ppFVar6 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  *)local_40,(long)local_50);
          pMVar7 = (Message *)(**(code **)(*ppFVar1 + 0xd8))(ppFVar1,message,*ppFVar6,0);
          bVar2 = CollectExtensions(pMVar7,extensions);
          if (!bVar2) {
            message_local._7_1_ = false;
            goto LAB_0041e4f5;
          }
        }
      }
    }
    message_local._7_1_ = true;
LAB_0041e4f5:
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_40);
  }
  else {
    message_local._7_1_ = false;
  }
  return message_local._7_1_;
}

Assistant:

bool CollectExtensions(const Message& message,
                       FieldDescriptorSet* extensions) {
  const Reflection* reflection = message.GetReflection();

  // There are unknown fields that could be extensions, thus this call fails.
  if (reflection->GetUnknownFields(message).field_count() > 0) return false;

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);

  for (int i = 0; i < fields.size(); i++) {
    if (fields[i]->is_extension()) extensions->insert(fields[i]);

    if (GetJavaType(fields[i]) == JAVATYPE_MESSAGE) {
      if (fields[i]->is_repeated()) {
        int size = reflection->FieldSize(message, fields[i]);
        for (int j = 0; j < size; j++) {
          const Message& sub_message =
            reflection->GetRepeatedMessage(message, fields[i], j);
          if (!CollectExtensions(sub_message, extensions)) return false;
        }
      } else {
        const Message& sub_message = reflection->GetMessage(message, fields[i]);
        if (!CollectExtensions(sub_message, extensions)) return false;
      }
    }
  }

  return true;
}